

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O1

PrintStatement * __thiscall Parser::printStmt(Parser *this)

{
  int iVar1;
  Testlist *testlist;
  PrintStatement *this_00;
  undefined8 extraout_RAX;
  Token tok;
  Token printKeyword;
  string local_140;
  string local_120;
  Token local_100;
  Token local_90;
  
  Tokenizer::getToken(&local_90,this->tokenizer);
  iVar1 = std::__cxx11::string::compare((char *)&local_90);
  if (iVar1 == 0) {
    Tokenizer::getToken(&local_100,this->tokenizer);
    if (local_100._eol == false) {
      Tokenizer::ungetToken(this->tokenizer);
      testlist = testList(this);
      this_00 = (PrintStatement *)operator_new(0x68);
      PrintStatement::PrintStatement(this_00,testlist);
    }
    else {
      Tokenizer::ungetToken(this->tokenizer);
      this_00 = (PrintStatement *)0x0;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._string._M_dataplus._M_p != &local_100._string.field_2) {
      operator_delete(local_100._string._M_dataplus._M_p,
                      local_100._string.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._relOp._M_dataplus._M_p != &local_100._relOp.field_2) {
      operator_delete(local_100._relOp._M_dataplus._M_p,
                      local_100._relOp.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._name._M_dataplus._M_p != &local_100._name.field_2) {
      operator_delete(local_100._name._M_dataplus._M_p,
                      local_100._name.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._string._M_dataplus._M_p != &local_90._string.field_2) {
      operator_delete(local_90._string._M_dataplus._M_p,
                      local_90._string.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._relOp._M_dataplus._M_p != &local_90._relOp.field_2) {
      operator_delete(local_90._relOp._M_dataplus._M_p,
                      local_90._relOp.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._name._M_dataplus._M_p != &local_90._name.field_2) {
      operator_delete(local_90._name._M_dataplus._M_p,
                      local_90._name.field_2._M_allocated_capacity + 1);
    }
    return this_00;
  }
  local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"Parser::printStmt","");
  local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_140,"Expected a name token, instead got","");
  die(this,&local_120,&local_140,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != &local_140.field_2) {
    operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != &local_120.field_2) {
    operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
  }
  Token::~Token(&local_90);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

PrintStatement *Parser::printStmt() {
    //'print' [ testlist ]


    Token printKeyword = tokenizer.getToken();
    if (!printKeyword.isPrint())
        die("Parser::printStmt", "Expected a name token, instead got", printKeyword);
    Testlist *list = nullptr;
    Token tok = tokenizer.getToken();

    if (!tok.eol()) {
        tokenizer.ungetToken();
        list = testList();
    } else{
        tokenizer.ungetToken();
        return nullptr;
    }
    auto *printStatement = new PrintStatement(list);
    return printStatement;
}